

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O2

void anon_unknown.dwarf_3d9e::NumberCase(void)

{
  allocator local_71;
  char *expected;
  string actual;
  string local_48;
  string f;
  
  std::__cxx11::string::string((string *)&f,"Number: %05d",(allocator *)&actual);
  GPIO::format<int>(&actual,&f,0x48);
  expected = "Number: 00072";
  std::__cxx11::string::string((string *)&local_48,"",&local_71);
  assert::are_equal<char_const*,std::__cxx11::string>(&expected,&actual,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&actual);
  std::__cxx11::string::~string((string *)&f);
  return;
}

Assistant:

void NumberCase()
    {
        std::string f = "Number: %05d";
        auto actual = GPIO::format(f, 72);
        auto expected = "Number: 00072";

        assert::are_equal(expected, actual);
    }